

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_RTreeIterator::First(ON_RTreeIterator *this)

{
  ON_RTreeIterator *this_local;
  
  this->m_sp = (StackElement *)0x0;
  if (((this->m_root == (ON_RTreeNode *)0x0) || (this->m_root->m_level < 0)) ||
     (this->m_root->m_count < 1)) {
    this_local._7_1_ = false;
  }
  else {
    this->m_stack[0].m_node = this->m_root;
    this->m_stack[0].m_branchIndex = 0;
    this_local._7_1_ = PushChildren(this,this->m_stack,true);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTreeIterator::First()
{ 
  m_sp = 0;
  if ( 0 == m_root || m_root->m_level < 0 || m_root->m_count <= 0 )
    return false;
  m_stack[0].m_node = m_root;
  m_stack[0].m_branchIndex = 0;
  return PushChildren(&m_stack[0],true);
}